

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_lzma_codec.cpp
# Opt level: O0

bool __thiscall crnlib::lzma_codec::pack(lzma_codec *this,void *p,uint n,vector<unsigned_char> *buf)

{
  uint uVar1;
  vector<unsigned_char> *in_RCX;
  uint in_EDX;
  void *in_RSI;
  undefined8 *in_RDI;
  uint trial;
  int status;
  size_t outPropsSize;
  size_t destLen;
  uint8 *pComp_data;
  header *pHDR;
  uint max_comp_size;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined1 grow_hint;
  uint in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_58;
  int local_54;
  undefined8 local_50;
  ulong local_48;
  uchar *local_40;
  packed_uint<2U> *local_38;
  uint local_2c;
  vector<unsigned_char> *local_28;
  uint local_1c;
  void *local_18;
  bool local_1;
  
  if (in_EDX < 0x40000001) {
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_2c = math::maximum<unsigned_int>(0x80,in_EDX >> 8);
    local_2c = in_EDX + local_2c;
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,SUB41((uint)in_stack_ffffffffffffff68 >> 0x18,0));
    local_38 = (packed_uint<2U> *)vector<unsigned_char>::operator[](local_28,0);
    local_40 = vector<unsigned_char>::operator[](local_28,0x14);
    utils::zero_object<crnlib::lzma_codec::header>((header *)0x151a76);
    packed_uint<4U>::operator=((packed_uint<4U> *)(local_38 + 0xc),local_1c);
    uVar1 = adler32(local_18,(ulong)local_1c,1);
    packed_uint<4U>::operator=((packed_uint<4U> *)(local_38 + 0x10),uVar1);
    if (local_1c != 0) {
      local_48 = 0;
      local_50 = 0;
      local_54 = 6;
      for (local_58 = 0; grow_hint = (undefined1)((uint)in_stack_ffffffffffffff68 >> 0x18),
          local_58 < 3; local_58 = local_58 + 1) {
        local_48 = (ulong)local_2c;
        local_50 = 5;
        in_stack_ffffffffffffff60 = 0;
        in_stack_ffffffffffffff68 = 0xffffffff;
        in_stack_ffffffffffffff70 = 0xffffffff;
        local_54 = (*(code *)*in_RDI)(local_40,&local_48,local_18,local_1c,local_38 + 3,&local_50,
                                      0xffffffff);
        grow_hint = (undefined1)((uint)in_stack_ffffffffffffff68 >> 0x18);
        if (local_54 != 7) break;
        local_2c = (local_1c + 1 >> 1) + local_2c;
        vector<unsigned_char>::resize
                  ((vector<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,(bool)grow_hint);
        local_38 = (packed_uint<2U> *)vector<unsigned_char>::operator[](local_28,0);
        local_40 = vector<unsigned_char>::operator[](local_28,0x14);
      }
      if (local_54 != 0) {
        vector<unsigned_char>::clear
                  ((vector<unsigned_char> *)
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        return false;
      }
      packed_uint<4U>::operator=((packed_uint<4U> *)(local_38 + 8),(uint)local_48);
      vector<unsigned_char>::resize
                ((vector<unsigned_char> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,(bool)grow_hint);
    }
    packed_uint<2U>::operator=(local_38,0x304c);
    uVar1 = adler32(local_38 + 3,0x11,1);
    local_38[2] = SUB41(uVar1,0);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool lzma_codec::pack(const void* p, uint n, crnlib::vector<uint8>& buf) {
  if (n > 1024U * 1024U * 1024U)
    return false;

  uint max_comp_size = n + math::maximum<uint>(128, n >> 8);
  buf.resize(sizeof(header) + max_comp_size);

  header* pHDR = reinterpret_cast<header*>(&buf[0]);
  uint8* pComp_data = &buf[sizeof(header)];

  utils::zero_object(*pHDR);

  pHDR->m_uncomp_size = n;
  pHDR->m_adler32 = adler32(p, n);

  if (n) {
    size_t destLen = 0;
    size_t outPropsSize = 0;
    int status = SZ_ERROR_INPUT_EOF;

    for (uint trial = 0; trial < 3; trial++) {
      destLen = max_comp_size;
      outPropsSize = cLZMAPropsSize;

      status = (*m_pCompress)(pComp_data, &destLen, reinterpret_cast<const unsigned char*>(p), n,
                              pHDR->m_lzma_props, &outPropsSize,
                              -1, /* 0 <= level <= 9, default = 5 */
                              0,  /* default = (1 << 24) */
                              -1, /* 0 <= lc <= 8, default = 3  */
                              -1, /* 0 <= lp <= 4, default = 0  */
                              -1, /* 0 <= pb <= 4, default = 2  */
                              -1, /* 5 <= fb <= 273, default = 32 */
                              (g_number_of_processors > 1) ? 2 : 1
                              );

      if (status != SZ_ERROR_OUTPUT_EOF)
        break;

      max_comp_size += ((n + 1) / 2);
      buf.resize(sizeof(header) + max_comp_size);
      pHDR = reinterpret_cast<header*>(&buf[0]);
      pComp_data = &buf[sizeof(header)];
    }

    if (status != SZ_OK) {
      buf.clear();
      return false;
    }

    pHDR->m_comp_size = static_cast<uint>(destLen);

    buf.resize(CRNLIB_SIZEOF_U32(header) + static_cast<uint32>(destLen));
  }

  pHDR->m_sig = header::cSig;
  pHDR->m_checksum = static_cast<uint8>(adler32((uint8*)pHDR + header::cChecksumSkipBytes, sizeof(header) - header::cChecksumSkipBytes));

  return true;
}